

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss.cc
# Opt level: O2

void xLearn::ce_evaluate_thread
               (vector<float,_std::allocator<float>_> *pred,
               vector<float,_std::allocator<float>_> *label,real_t *tmp_sum,size_t start_idx,
               size_t end_idx)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  size_t i;
  undefined1 auVar4 [16];
  float fVar5;
  allocator local_6e;
  allocator local_6d;
  Logger local_6c;
  string local_68;
  string local_48;
  
  if (start_idx <= end_idx) {
    *tmp_sum = 0.0;
    for (; end_idx != start_idx; start_idx = start_idx + 1) {
      fVar5 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[start_idx];
      uVar1 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                             ZEXT416((uint)(label->super__Vector_base<float,_std::allocator<float>_>
                                           )._M_impl.super__Vector_impl_data._M_start[start_idx]),1)
      ;
      bVar2 = (bool)((byte)uVar1 & 1);
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar4 = vxorps_avx512vl(ZEXT416((uint)fVar5),auVar4);
      fVar5 = expf((float)((uint)bVar2 * auVar4._0_4_ + (uint)!bVar2 * (int)fVar5));
      fVar5 = log1pf(fVar5);
      *tmp_sum = fVar5 + *tmp_sum;
    }
    return;
  }
  local_6c.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/cross_entropy_loss.cc"
             ,&local_6d);
  std::__cxx11::string::string((string *)&local_68,"ce_evaluate_thread",&local_6e);
  poVar3 = Logger::Start(ERR,&local_48,0x22,&local_68);
  poVar3 = std::operator<<(poVar3,"CHECK_GE failed ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/cross_entropy_loss.cc"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x22);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"end_idx");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"start_idx");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

static void ce_evaluate_thread(const std::vector<real_t>* pred,
                              const std::vector<real_t>* label,
                              real_t* tmp_sum,
                              size_t start_idx,
                              size_t end_idx) {
  CHECK_GE(end_idx, start_idx);
  *tmp_sum = 0;
  for (size_t i = start_idx; i < end_idx; ++i) {
    real_t y = (*label)[i] > 0 ? 1.0 : -1.0;
    (*tmp_sum) += log1p(exp(-y*(*pred)[i]));
  }
}